

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int vdbeRecordCompareString(int nKey1,void *pKey1,UnpackedRecord *pPKey2)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int serial_type;
  uint local_34;
  
  local_34 = (uint)*(char *)((long)pKey1 + 1);
  while ((int)local_34 < 0xc) {
    if ((-1 < (int)local_34) ||
       (sqlite3GetVarint32((uchar *)((long)pKey1 + 1),&local_34), (int)local_34 < 0xc))
    goto LAB_001657d4;
  }
  if ((local_34 & 1) != 0) {
    uVar4 = local_34 - 0xc >> 1;
    if (nKey1 < (int)(*pKey1 + uVar4)) {
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x1531b,
                  "89c459e766ea7e9165d0beeb124708b955a4950d0f4792f457465d71b158d318");
      pPKey2->errCode = '\v';
      return 0;
    }
    uVar1 = pPKey2->n;
    uVar2 = uVar4;
    if ((int)uVar1 < (int)uVar4) {
      uVar2 = uVar1;
    }
    iVar3 = memcmp((void *)((ulong)*pKey1 + (long)pKey1),(pPKey2->u).z,(long)(int)uVar2);
    if (iVar3 < 1) {
      if (-1 < iVar3) {
        if (uVar4 == uVar1) {
          if (pPKey2->nField < 2) {
            pPKey2->eqSeen = '\x01';
            return (int)pPKey2->default_rc;
          }
          iVar3 = sqlite3VdbeRecordCompareWithSkip(nKey1,pKey1,pPKey2,1);
          return iVar3;
        }
        if ((int)uVar1 < (int)uVar4) goto LAB_001657e0;
      }
LAB_001657d4:
      return (int)pPKey2->r1;
    }
  }
LAB_001657e0:
  return (int)pPKey2->r2;
}

Assistant:

static int vdbeRecordCompareString(
  int nKey1, const void *pKey1, /* Left key */
  UnpackedRecord *pPKey2        /* Right key */
){
  const u8 *aKey1 = (const u8*)pKey1;
  int serial_type;
  int res;

  assert( pPKey2->aMem[0].flags & MEM_Str );
  assert( pPKey2->aMem[0].n == pPKey2->n );
  assert( pPKey2->aMem[0].z == pPKey2->u.z );
  vdbeAssertFieldCountWithinLimits(nKey1, pKey1, pPKey2->pKeyInfo);
  serial_type = (signed char)(aKey1[1]);

vrcs_restart:
  if( serial_type<12 ){
    if( serial_type<0 ){
      sqlite3GetVarint32(&aKey1[1], (u32*)&serial_type);
      if( serial_type>=12 ) goto vrcs_restart;
      assert( CORRUPT_DB );
    }
    res = pPKey2->r1;      /* (pKey1/nKey1) is a number or a null */
  }else if( !(serial_type & 0x01) ){
    res = pPKey2->r2;      /* (pKey1/nKey1) is a blob */
  }else{
    int nCmp;
    int nStr;
    int szHdr = aKey1[0];

    nStr = (serial_type-12) / 2;
    if( (szHdr + nStr) > nKey1 ){
      pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
      return 0;    /* Corruption */
    }
    nCmp = MIN( pPKey2->n, nStr );
    res = memcmp(&aKey1[szHdr], pPKey2->u.z, nCmp);

    if( res>0 ){
      res = pPKey2->r2;
    }else if( res<0 ){
      res = pPKey2->r1;
    }else{
      res = nStr - pPKey2->n;
      if( res==0 ){
        if( pPKey2->nField>1 ){
          res = sqlite3VdbeRecordCompareWithSkip(nKey1, pKey1, pPKey2, 1);
        }else{
          res = pPKey2->default_rc;
          pPKey2->eqSeen = 1;
        }
      }else if( res>0 ){
        res = pPKey2->r2;
      }else{
        res = pPKey2->r1;
      }
    }
  }

  assert( vdbeRecordCompareDebug(nKey1, pKey1, pPKey2, res)
       || CORRUPT_DB
       || pPKey2->pKeyInfo->db->mallocFailed
  );
  return res;
}